

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# radix_sort.hpp
# Opt level: O3

void burst::detail::
     radix_sort_impl_bi_iteration<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,burst::compose_fn<burst::shift_to_unsigned_fn,burst::identity_fn>,burst::low_byte_fn,int(*)[256],int*>
               (void *first,void *last,void *buffer_begin,long param_4,long param_5,long param_6)

{
  undefined4 *puVar1;
  int iVar2;
  long lVar3;
  ulong uVar4;
  void *pvVar5;
  long lVar6;
  long lVar7;
  size_t __n;
  
  __n = (long)last - (long)first;
  lVar6 = (long)__n >> 2;
  lVar3 = (long)*(int *)(param_5 + param_6 * 4);
  lVar7 = (long)*(int *)(param_5 + 4 + param_6 * 4);
  if (lVar6 != lVar7 || lVar6 != lVar3) {
    if (lVar6 == lVar3) {
      if (last != first) {
        memmove(buffer_begin,first,__n);
      }
    }
    else if (last != first) {
      lVar3 = param_6 * 0x400 + param_4;
      pvVar5 = last;
      do {
        uVar4 = (ulong)(*(uint *)((long)pvVar5 + -4) >> ((char)param_6 * '\b' & 0x1fU) & 0xff);
        iVar2 = *(int *)(lVar3 + uVar4 * 4);
        *(int *)(lVar3 + uVar4 * 4) = iVar2 + -1;
        puVar1 = (undefined4 *)((long)pvVar5 + -4);
        pvVar5 = (void *)((long)pvVar5 + -4);
        *(undefined4 *)((long)buffer_begin + (long)iVar2 * 4 + -4) = *puVar1;
      } while (pvVar5 != first);
    }
    if (lVar6 == lVar7) {
      if (last != first) {
        memmove(first,buffer_begin,__n);
        return;
      }
    }
    else if (last != first) {
      param_4 = param_4 + (param_6 + 1) * 0x400;
      do {
        uVar4 = (ulong)(*(uint *)((long)buffer_begin + (__n - 4)) >>
                        ((byte)((int)(param_6 + 1) << 3) & 0x1f) & 0xff);
        iVar2 = *(int *)(param_4 + uVar4 * 4);
        *(int *)(param_4 + uVar4 * 4) = iVar2 + -1;
        *(undefined4 *)((long)first + (long)iVar2 * 4 + -4) =
             *(undefined4 *)((long)buffer_begin + (__n - 4));
        __n = __n - 4;
      } while (__n != 0);
    }
  }
  return;
}

Assistant:

void
            radix_sort_impl_bi_iteration
            (
                RandomAccessIterator1 first,
                RandomAccessIterator1 last,
                RandomAccessIterator2 buffer_begin,
                Map map,
                Radix radix,
                RandomAccessIterator3 counters,
                RandomAccessIterator4 maximums,
                std::size_t radix_number
            )
        {
            using std::distance;
            const auto range_size = distance(first, last);
            const auto buffer_end = std::next(buffer_begin, range_size);

            const auto nth_is_single = maximums[radix_number] == range_size;
            const auto n1th_is_single = maximums[radix_number + 1] == range_size;

            if (nth_is_single && n1th_is_single)
            {
                return;
            }

            if (nth_is_single)
            {
                std::move(first, last, buffer_begin);
            }
            else
            {
                dispose_backward(std::make_move_iterator(first), std::make_move_iterator(last), buffer_begin, compose(nth_radix(radix_number, radix), map), std::begin(counters[radix_number]));
            }

            if (n1th_is_single)
            {
                std::move(buffer_begin, buffer_end, first);
            }
            else
            {
                dispose_backward(std::make_move_iterator(buffer_begin), std::make_move_iterator(buffer_end), first, compose(nth_radix(radix_number + 1, radix), map), std::begin(counters[radix_number + 1]));
            }
        }